

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall
Fl_Text_Display::extend_range_for_styles(Fl_Text_Display *this,int *startpos,int *endpos)

{
  Fl_Text_Buffer *pFVar1;
  int iVar2;
  int pos;
  
  pFVar1 = this->mStyleBuffer;
  if ((pFVar1->mPrimary).mSelected != true) {
    return;
  }
  iVar2 = (pFVar1->mPrimary).mStart;
  if (iVar2 < *startpos) {
    *startpos = iVar2;
    iVar2 = Fl_Text_Buffer::utf8_align(this->mBuffer,iVar2);
    *startpos = iVar2;
    iVar2 = (pFVar1->mPrimary).mEnd;
    pos = *endpos;
    if (iVar2 <= pos) goto LAB_001d4494;
  }
  else {
    iVar2 = (pFVar1->mPrimary).mEnd;
    if (iVar2 <= *endpos) {
      return;
    }
  }
  *endpos = iVar2;
  pos = Fl_Text_Buffer::utf8_align(this->mBuffer,iVar2);
  *endpos = pos;
LAB_001d4494:
  iVar2 = Fl_Text_Buffer::line_end(this->mBuffer,pos);
  *endpos = iVar2 + 1;
  return;
}

Assistant:

void Fl_Text_Display::extend_range_for_styles( int *startpos, int *endpos ) {
  IS_UTF8_ALIGNED2(buffer(), (*startpos))
  IS_UTF8_ALIGNED2(buffer(), (*endpos))

  Fl_Text_Selection * sel = mStyleBuffer->primary_selection();
  int extended = 0;

  /* The peculiar protocol used here is that modifications to the style
   buffer are marked by selecting them with the buffer's primary Fl_Text_Selection.
   The style buffer is usually modified in response to a modify callback on
   the text buffer BEFORE Fl_Text_Display.c's modify callback, so that it can keep
   the style buffer in step with the text buffer.  The style-update
   callback can't just call for a redraw, because Fl_Text_Display hasn't processed
   the original text changes yet.  Anyhow, to minimize redrawing and to
   avoid the complexity of scheduling redraws later, this simple protocol
   tells the text display's buffer modify callback to extend its redraw
   range to show the text color/and font changes as well. */
  if ( sel->selected() ) {
    if ( sel->start() < *startpos ) {
      *startpos = sel->start();
      // somewhere while deleting, alignment is lost. We do this just to be sure.
      *startpos = buffer()->utf8_align(*startpos);
      IS_UTF8_ALIGNED2(buffer(), (*startpos))
      extended = 1;
    }
    if ( sel->end() > *endpos ) {
      *endpos = sel->end();
      *endpos = buffer()->utf8_align(*endpos);
      IS_UTF8_ALIGNED2(buffer(), (*endpos))
      extended = 1;
    }
  }

  /* If the Fl_Text_Selection was extended due to a style change, and some of the
   fonts don't match in spacing, extend redraw area to end of line to
   redraw characters exposed by possible font size changes */
  if ( extended )
    *endpos = mBuffer->line_end( *endpos ) + 1;

  IS_UTF8_ALIGNED2(buffer(), (*endpos))
}